

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Input::beginBitSetScalar(Input *this,bool *DoClear)

{
  _Bit_type *p_Var1;
  HNode *hnode;
  iterator __position;
  Twine local_40;
  
  p_Var1 = (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  hnode = this->CurrentNode;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = p_Var1;
  (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  if (hnode != (HNode *)0x0) {
    if (hnode->_node->TypeID == 5) {
      __position.super__Bit_iterator_base._8_8_ = 0;
      __position.super__Bit_iterator_base._M_p = p_Var1;
      std::vector<bool,_std::allocator<bool>_>::_M_fill_insert
                (&this->BitValuesUsed,__position,
                 (long)hnode[1]._node - (long)hnode[1]._vptr_HNode >> 3,false);
    }
    else {
      Twine::Twine(&local_40,"expected sequence of bit values");
      setError(this,hnode,&local_40);
    }
    *DoClear = true;
    return true;
  }
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                ,0x69,
                "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
               );
}

Assistant:

bool Input::beginBitSetScalar(bool &DoClear) {
  BitValuesUsed.clear();
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    BitValuesUsed.insert(BitValuesUsed.begin(), SQ->Entries.size(), false);
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  DoClear = true;
  return true;
}